

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QIconModeViewBase::appendHiddenRow(QIconModeViewBase *this,int row)

{
  QListViewItem *pQVar1;
  QBspTreeData data;
  long in_FS_OFFSET;
  QRect local_28;
  long local_18;
  
  data.field_0._4_4_ = 0;
  data.field_0.i = row;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((-1 < row) && ((ulong)data.field_0 < (ulong)(this->items).d.size)) {
    pQVar1 = (this->items).d.ptr;
    local_28.x2.m_i = pQVar1[(long)data.field_0].x + (int)pQVar1[(long)data.field_0].w + -1;
    local_28.y1.m_i = pQVar1[(long)data.field_0].y;
    local_28.x1.m_i = pQVar1[(long)data.field_0].x;
    local_28.y2.m_i = (int)pQVar1[(long)data.field_0].h + pQVar1[(long)data.field_0].y + -1;
    QBspTree::climbTree(&this->tree,&local_28,QBspTree::remove,data,0);
  }
  QCommonListViewBase::appendHiddenRow(&this->super_QCommonListViewBase,row);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::appendHiddenRow(int row)
{
    if (row >= 0 && row < items.size()) //remove item
        tree.removeLeaf(items.at(row).rect(), row);
    QCommonListViewBase::appendHiddenRow(row);
}